

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::UniformType::UniformType
          (UniformType *this,GLenum _enumType,
          vector<int,_std::allocator<int>_> *_arraySizesSegmented)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  int iVar5;
  
  this->enumType = _enumType;
  std::vector<int,_std::allocator<int>_>::vector(&this->arraySizesSegmented,_arraySizesSegmented);
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childTypes).
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->strType)._M_dataplus._M_p = (pointer)&(this->strType).field_2;
  (this->strType)._M_string_length = 0;
  uVar4 = 0;
  (this->strType).field_2._M_local_buf[0] = '\0';
  (this->refStrType)._M_dataplus._M_p = (pointer)&(this->refStrType).field_2;
  (this->refStrType)._M_string_length = 0;
  (this->refStrType).field_2._M_local_buf[0] = '\0';
  (this->size).first = 0;
  (this->size).second = 0;
  this->isArray = true;
  this->signedType = true;
  this->arraySize = 1;
  piVar2 = (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar5 = 1;
  while( true ) {
    if ((ulong)((long)piVar3 - (long)piVar2 >> 2) <= uVar4) {
      fill(this);
      return;
    }
    iVar1 = piVar2[uVar4];
    if (iVar1 < 1) break;
    iVar5 = iVar5 * iVar1;
    this->arraySize = iVar5;
    uVar4 = uVar4 + 1;
  }
  __assert_fail("arraySizesSegmented[i] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x11b,
                "glcts::(anonymous namespace)::UniformType::UniformType(GLenum, const std::vector<int> &)"
               );
}

Assistant:

UniformType(GLenum _enumType, const std::vector<int>& _arraySizesSegmented)
		: enumType(_enumType), arraySizesSegmented(_arraySizesSegmented), isArray(true), signedType(true)
	{
		arraySize = 1;
		for (size_t i = 0; i < arraySizesSegmented.size(); i++)
		{
			assert(arraySizesSegmented[i] > 0);
			arraySize *= arraySizesSegmented[i];
		}
		fill();
	}